

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall Parameter<bool>::internalSetData<int>(Parameter<bool> *this,int data)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  bool result;
  bool tmp;
  RepType_conflict local_d [13];
  
  local_d[0] = false;
  bVar1 = ParameterTraits<bool>::convert<int>(in_ESI,local_d);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    *(byte *)(in_RDI + 0x2b) = local_d[0] & 1;
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }